

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

uint8_t * __thiscall
edition_unittest::TestOneof2_FooGroup::_InternalSerialize
          (TestOneof2_FooGroup *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  int32_t value;
  uint32_t *puVar2;
  WireFormatLite *this_00;
  size_type sVar3;
  UnknownFieldSet *unknown_fields;
  char *in_R9;
  string_view field_name;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined1 local_40 [8];
  string_view _s;
  uint32_t cached_has_bits;
  TestOneof2_FooGroup *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestOneof2_FooGroup *this_local;
  
  _s._M_str._4_4_ = 0;
  puVar2 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  _s._M_str._4_4_ = *puVar2;
  stream_local = (EpsCopyOutputStream *)target;
  if ((_s._M_str._4_4_ & 2) != 0) {
    value = _internal_a(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<9>
                             (stream,value,target);
  }
  if ((_s._M_str._4_4_ & 1) != 0) {
    _local_40 = _internal_b(this);
    this_00 = (WireFormatLite *)
              std::basic_string_view<char,_std::char_traits<char>_>::data
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_40);
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_40);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_50,"edition_unittest.TestOneof2.FooGroup.b");
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)local_50._M_str;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (this_00,(char *)(sVar3 & 0xffffffff),1,(Operation)local_50._M_len,field_name);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,10,_local_40,(uint8_t *)stream_local);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestOneof2_FooGroup::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestOneof2_FooGroup& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestOneof2.FooGroup)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int32 a = 9;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<9>(
            stream, this_._internal_a(), target);
  }

  // string b = 10;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::absl::string_view _s = this_._internal_b();
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "edition_unittest.TestOneof2.FooGroup.b");
    target = stream->WriteStringMaybeAliased(10, _s, target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestOneof2.FooGroup)
  return target;
}